

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O3

void __thiscall Robot::calcWorldVelocity(Robot *this)

{
  pointer pdVar1;
  pointer pdVar2;
  double dVar3;
  pointer pdVar4;
  int i;
  long lVar5;
  value_type_conflict1 *__val;
  long lVar6;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b;
  vector<double,_std::allocator<double>_> local_40;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28;
  
  pdVar4 = (pointer)operator_new(0x18);
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar4 + 3;
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  pdVar4[2] = 0.0;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar4;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  bMatrix(&local_28,(this->robotInfo).theta);
  pdVar1 = (this->robotInfo).selfCorVelocity.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  do {
    pdVar4[lVar5] = 0.0;
    pdVar2 = local_28.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar3 = 0.0;
    lVar6 = 0;
    do {
      dVar3 = dVar3 + pdVar2[lVar6] * pdVar1[lVar6];
      pdVar4[lVar5] = dVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->robotInfo).robotVelocity,&local_40);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28);
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Robot::calcWorldVelocity() {
    std::vector<double> ans(3);
    std::vector<std::vector<double> > b = bMatrix(this->robotInfo.theta);
    for (int i = 0; i < 3; i++) {
        ans[i] = 0;
        for (int j = 0; j < 3; j++) {
            ans[i] += b[i][j] * this->robotInfo.selfCorVelocity[j];
        }
    }
    this->robotInfo.robotVelocity = ans;
}